

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

QByteArray * __thiscall
QSslSocketPrivate::peek(QByteArray *__return_storage_ptr__,QSslSocketPrivate *this,qint64 maxSize)

{
  char *pcVar1;
  Data *pDVar2;
  qsizetype qVar3;
  longlong __old_val;
  AllocationOption AVar4;
  long in_FS_OFFSET;
  QArrayData *local_88;
  char *pcStack_80;
  qsizetype local_78;
  QStringBuilder<QByteArray_&,_QByteArray> local_68;
  QByteArray local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->mode == UnencryptedMode) && (this->autoStartHandshake == false)) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (char *)0x0;
    AVar4 = Grow;
    local_48.d.size = 0;
    if (0 < maxSize) {
      AVar4 = (AllocationOption)maxSize;
    }
    QByteArray::reallocData((longlong)&local_48,AVar4);
    if ((&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) &&
       (*(qsizetype *)((long)local_48.d.d + 8) != 0)) {
      *(byte *)&(((ArrayOptions *)((long)local_48.d.d + 4))->
                super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(((ArrayOptions *)((long)local_48.d.d + 4))->
                 super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    if ((&(local_48.d.d)->super_QArrayData == (QArrayData *)0x0) ||
       (1 < ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&local_48,(AllocationOption)local_48.d.size);
    }
    pcVar1 = *(char **)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x90;
    if (pcVar1 != (char *)0x0) {
      QRingBuffer::peek(pcVar1,(longlong)local_48.d.ptr,maxSize);
    }
    QByteArray::resize((longlong)&local_48);
    qVar3 = local_48.d.size;
    pcVar1 = local_48.d.ptr;
    pDVar2 = local_48.d.d;
    if (maxSize == local_48.d.size) {
      local_48.d.d = (Data *)0x0;
      local_48.d.ptr = (char *)0x0;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = pcVar1;
      local_48.d.size = 0;
      (__return_storage_ptr__->d).size = qVar3;
    }
    else if (this->plainSocket == (QTcpSocket *)0x0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      QIODevice::peek((longlong)&local_88);
      local_68.b.d.size = local_78;
      local_68.b.d.ptr = pcStack_80;
      local_68.b.d.d = (Data *)local_88;
      local_88 = (QArrayData *)0x0;
      pcStack_80 = (char *)0x0;
      local_78 = 0;
      local_68.a = &local_48;
      QStringBuilder<QByteArray_&,_QByteArray>::convertTo<QByteArray>
                (__return_storage_ptr__,&local_68);
      if (&(local_68.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.b.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,1,0x10);
        }
      }
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_0025470a:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_0025470a;
    QIODevicePrivate::peek((longlong)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QSslSocketPrivate::peek(qint64 maxSize)
{
    if (mode == QSslSocket::UnencryptedMode && !autoStartHandshake) {
        //unencrypted mode - do not use QIODevice::peek, as it reads ahead data from the plain socket
        //peek at data already in the QIODevice buffer (from a previous read)
        QByteArray ret;
        ret.reserve(maxSize);
        ret.resize(buffer.peek(ret.data(), maxSize, transactionPos));
        if (ret.size() == maxSize)
            return ret;
        //peek at data in the plain socket
        if (plainSocket)
            return ret + plainSocket->peek(maxSize - ret.size());

        return QByteArray();
    } else {
        //encrypted mode - the socket engine will read and decrypt data into the QIODevice buffer
        return QTcpSocketPrivate::peek(maxSize);
    }
}